

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall google::protobuf::compiler::Parser::TryConsume(Parser *this,string_view text)

{
  Tokenizer *this_00;
  size_t __n;
  int iVar1;
  bool bVar2;
  
  this_00 = this->input_;
  __n = (this_00->current_).text._M_string_length;
  if (__n == text._M_len) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp((this_00->current_).text._M_dataplus._M_p,text._M_str,__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (bVar2 != false) {
    io::Tokenizer::Next(this_00);
  }
  return bVar2;
}

Assistant:

inline bool Parser::LookingAt(absl::string_view text) {
  return input_->current().text == text;
}